

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O2

void __thiscall helics::apps::Clone::~Clone(Clone *this)

{
  (this->super_App)._vptr_App = (_func_int **)&PTR__Clone_00483170;
  if ((this->fileSaved == false) && ((this->super_App).outFileName._M_string_length != 0)) {
    saveFile(this,&(this->super_App).outFileName);
  }
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->pubPointCount).super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)&this->fedConfig);
  std::__cxx11::string::~string((string *)&this->captureFederate);
  CLI::std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->eptNames)._M_t);
  CLI::std::
  _Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_int>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_int>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::~_Rb_tree(&(this->eptids)._M_t);
  CLI::std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->subkeys)._M_t);
  CLI::std::
  _Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_int>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_int>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::~_Rb_tree(&(this->subids)._M_t);
  CLI::std::
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ::~vector(&this->messages);
  CLI::std::unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_>::~unique_ptr
            (&this->cloneEndpoint);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->cloneSubscriptionNames);
  CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::~deque(&this->subscriptions);
  CLI::std::
  vector<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>::
  ~vector(&this->points);
  CLI::std::unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>::
  ~unique_ptr(&this->cFilt);
  App::~App(&this->super_App);
  return;
}

Assistant:

Clone::~Clone()
{
    try {
        if (!fileSaved && !outFileName.empty()) {
            saveFile(outFileName);
        }
    }
    catch (...) {
        // destructors should not throw
        ;
    }
}